

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

counting_iterator
fmt::v10::detail::write_codepoint<4ul,char,fmt::v10::detail::counting_iterator>
          (counting_iterator out,char prefix,uint32_t cp)

{
  char buf [4];
  
  builtin_strncpy(buf,"0000",4);
  format_uint<4u,char,unsigned_int>(buf,cp,4,false);
  return (counting_iterator)(out.count_ + 6);
}

Assistant:

auto write_codepoint(OutputIt out, char prefix, uint32_t cp) -> OutputIt {
  *out++ = static_cast<Char>('\\');
  *out++ = static_cast<Char>(prefix);
  Char buf[width];
  fill_n(buf, width, static_cast<Char>('0'));
  format_uint<4>(buf, cp, width);
  return copy_str<Char>(buf, buf + width, out);
}